

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_3dmeasure.c
# Opt level: O2

HPDF_STATUS HPDF_3DC3DMeasure_SetTextBoxSize(HPDF_3DMeasure measure,HPDF_INT32 x,HPDF_INT32 y)

{
  HPDF_Array array;
  HPDF_STATUS HVar1;
  HPDF_STATUS HVar2;
  
  array = HPDF_Array_New(measure->mmgr);
  if (array != (HPDF_Array)0x0) {
    HVar1 = HPDF_Dict_Add(measure,"TB",array);
    if (HVar1 == 0) {
      HVar2 = HPDF_Array_AddNumber(array,x);
      HVar1 = HPDF_Array_AddNumber(array,y);
      HVar1 = HVar1 + HVar2;
    }
    return HVar1;
  }
  HVar1 = HPDF_Error_GetCode(measure->error);
  return HVar1;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_3DC3DMeasure_SetTextBoxSize(HPDF_3DMeasure measure, 
							 HPDF_INT32 x,
							 HPDF_INT32 y)
{
	HPDF_Array array;
	HPDF_STATUS ret = HPDF_OK;

	array = HPDF_Array_New (measure->mmgr);
	if (!array)
		return HPDF_Error_GetCode (measure->error);

	ret = HPDF_Dict_Add (measure, "TB", array);
	if (ret != HPDF_OK)
		return ret;

	ret += HPDF_Array_AddNumber(array, x);
	ret += HPDF_Array_AddNumber(array, y);

	return ret;
}